

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

void __thiscall
ON_SurfaceCurvatureColorMapping::ON_SurfaceCurvatureColorMapping
          (ON_SurfaceCurvatureColorMapping *this,curvature_style kappa_style,ON_Interval kappa_range
          )

{
  bool bVar1;
  curvature_style cVar2;
  ON_Interval *local_40;
  curvature_style kappa_style_local;
  ON_SurfaceCurvatureColorMapping *this_local;
  ON_Interval kappa_range_local;
  
  kappa_range_local.m_t[0] = kappa_range.m_t[1];
  this_local = kappa_range.m_t[0];
  this->m_is_set = '\x02';
  this->m_reserved1 = '\0';
  this->m_reserved2 = 0;
  cVar2 = ON::CurvatureStyle(kappa_style);
  this->m_kappa_style = cVar2;
  bVar1 = ON_Interval::IsValid((ON_Interval *)&this_local);
  if (bVar1) {
    local_40 = (ON_Interval *)&this_local;
  }
  else {
    local_40 = &ON_Interval::Nan;
  }
  (this->m_kappa_range).m_t[0] = (double)local_40->m_t[0];
  (this->m_kappa_range).m_t[1] = (double)local_40->m_t[1];
  (this->m_hue_range_in_radians).m_t[0] = DefaultHueRangeRadians.m_t[0];
  (this->m_hue_range_in_radians).m_t[1] = DefaultHueRangeRadians.m_t[1];
  return;
}

Assistant:

ON_SurfaceCurvatureColorMapping::ON_SurfaceCurvatureColorMapping(
  ON::curvature_style kappa_style,
  ON_Interval kappa_range
)
  : m_is_set(2)
  , m_kappa_style(ON::CurvatureStyle((int)(kappa_style)))
  , m_kappa_range(kappa_range.IsValid() ? kappa_range : ON_Interval::Nan)
{}